

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Expression
dynet::detail::
f<dynet::AffineTransform,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
          (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *xs)

{
  bool bVar1;
  pointer pEVar2;
  ComputationGraph *pg_00;
  reference pvVar3;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_RDI;
  const_iterator xi;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  ComputationGraph *pg;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  VariableIndex in_stack_ffffffffffffff84;
  Expression *this;
  size_type in_stack_ffffffffffffff98;
  __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
  in_stack_ffffffffffffffa0;
  int local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  ComputationGraph *in_stack_ffffffffffffffc0;
  __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
  local_28;
  ComputationGraph *local_20;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_18;
  Expression local_10;
  
  local_18 = in_RDI;
  local_28._M_current =
       (Expression *)
       std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::begin
                 (in_stack_ffffffffffffff78);
  pEVar2 = __gnu_cxx::
           __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
           ::operator->(&local_28);
  local_20 = pEVar2->pg;
  pg_00 = (ComputationGraph *)
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::size(local_18);
  this = (Expression *)&stack0xffffffffffffffbf;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xdca73b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffffa0._M_current,in_stack_ffffffffffffff98,(allocator_type *)this);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xdca75b);
  local_58 = 0;
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::begin
            (in_stack_ffffffffffffff78);
  while( true ) {
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::end
              (in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (__normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
             ::operator->((__normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
                           *)&stack0xffffffffffffffa0);
    in_stack_ffffffffffffff84 = pEVar2->i;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffffc0,(long)local_58);
    *pvVar3 = in_stack_ffffffffffffff84;
    __gnu_cxx::
    __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
    ::operator++((__normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
                  *)&stack0xffffffffffffffa0);
    local_58 = local_58 + 1;
  }
  ComputationGraph::
  add_function<dynet::AffineTransform,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Expression::Expression(this,pg_00,in_stack_ffffffffffffff84);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return local_10;
}

Assistant:

Expression f(const T& xs) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis));
}